

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_clusterizer.h
# Opt level: O1

void __thiscall
crnlib::clusterizer<crnlib::vec<2U,_float>_>::clear(clusterizer<crnlib::vec<2U,_float>_> *this)

{
  pair<crnlib::vec<2U,_float>,_unsigned_int> *p;
  vec<2U,_float> *p_00;
  vq_node *pvVar1;
  void *p_01;
  ulong uVar2;
  long lVar3;
  
  p = (this->m_training_vecs).m_p;
  if (p != (pair<crnlib::vec<2U,_float>,_unsigned_int> *)0x0) {
    crnlib_free(p);
    (this->m_training_vecs).m_p = (pair<crnlib::vec<2U,_float>,_unsigned_int> *)0x0;
    (this->m_training_vecs).m_size = 0;
    (this->m_training_vecs).m_capacity = 0;
  }
  p_00 = (this->m_codebook).m_p;
  if (p_00 != (vec<2U,_float> *)0x0) {
    crnlib_free(p_00);
    (this->m_codebook).m_p = (vec<2U,_float> *)0x0;
    (this->m_codebook).m_size = 0;
    (this->m_codebook).m_capacity = 0;
  }
  pvVar1 = (this->m_nodes).m_p;
  if (pvVar1 != (vq_node *)0x0) {
    uVar2 = (ulong)(this->m_nodes).m_size;
    if (uVar2 != 0) {
      lVar3 = 0;
      do {
        p_01 = *(void **)((long)&((vector<unsigned_int> *)(&pvVar1->m_centroid + 3))->m_p + lVar3);
        if (p_01 != (void *)0x0) {
          crnlib_free(p_01);
        }
        lVar3 = lVar3 + 0x38;
      } while (uVar2 * 0x38 - lVar3 != 0);
    }
    crnlib_free((this->m_nodes).m_p);
    (this->m_nodes).m_p = (vq_node *)0x0;
    (this->m_nodes).m_size = 0;
    (this->m_nodes).m_capacity = 0;
  }
  this->m_overall_variance = 0.0;
  this->m_split_index = 0;
  this->m_heap_size = 0;
  this->m_quick = false;
  return;
}

Assistant:

void clear()
        {
            m_training_vecs.clear();
            m_codebook.clear();
            m_nodes.clear();
            m_overall_variance = 0.0f;
            m_split_index = 0;
            m_heap_size = 0;
            m_quick = false;
        }